

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# policy.cpp
# Opt level: O2

bool IsStandardTx(CTransaction *tx,optional<unsigned_int> *max_datacarrier_bytes,
                 bool permit_bare_multisig,CFeeRate *dust_relay_fee,string *reason)

{
  pointer pCVar1;
  pointer pCVar2;
  bool bVar3;
  uint uVar4;
  char *__s;
  CTxOut *txout;
  pointer pCVar5;
  pointer txout_00;
  long in_FS_OFFSET;
  TxoutType whichType;
  uint local_44;
  TxoutType local_3c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (tx->version - 4 < 0xfffffffd) {
    __s = "version";
  }
  else {
    uVar4 = GetTransactionWeight(tx);
    if (uVar4 < 0x61a81) {
      pCVar5 = (tx->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
               super__Vector_impl_data._M_start;
      pCVar1 = (tx->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
               super__Vector_impl_data._M_finish;
      do {
        if (pCVar5 == pCVar1) {
          txout_00 = (tx->vout).super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                     super__Vector_impl_data._M_start;
          pCVar2 = (tx->vout).super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                   super__Vector_impl_data._M_finish;
          local_44 = 0;
          goto LAB_0058b8e6;
        }
        if (0x68f < (pCVar5->scriptSig).super_CScriptBase._size) {
          __s = "scriptsig-size";
          goto LAB_0058b962;
        }
        bVar3 = CScript::IsPushOnly(&pCVar5->scriptSig);
        pCVar5 = pCVar5 + 1;
      } while (bVar3);
      __s = "scriptsig-not-pushonly";
    }
    else {
      __s = "tx-size";
    }
  }
LAB_0058b962:
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::assign
            (reason,__s);
  bVar3 = false;
LAB_0058b96c:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return bVar3;
  }
  __stack_chk_fail();
LAB_0058b8e6:
  if (txout_00 == pCVar2) goto LAB_0058b937;
  bVar3 = IsStandard(&txout_00->scriptPubKey,max_datacarrier_bytes,&local_3c);
  if (!bVar3) {
    __s = "scriptpubkey";
    goto LAB_0058b962;
  }
  if (local_3c == MULTISIG) {
    if (!permit_bare_multisig) {
      __s = "bare-multisig";
      goto LAB_0058b962;
    }
LAB_0058b919:
    bVar3 = IsDust(txout_00,dust_relay_fee);
    if (bVar3) {
      __s = "dust";
      goto LAB_0058b962;
    }
  }
  else {
    if (local_3c != NULL_DATA) goto LAB_0058b919;
    local_44 = local_44 + 1;
  }
  txout_00 = txout_00 + 1;
  goto LAB_0058b8e6;
LAB_0058b937:
  bVar3 = true;
  if (local_44 < 2) goto LAB_0058b96c;
  __s = "multi-op-return";
  goto LAB_0058b962;
}

Assistant:

bool IsStandardTx(const CTransaction& tx, const std::optional<unsigned>& max_datacarrier_bytes, bool permit_bare_multisig, const CFeeRate& dust_relay_fee, std::string& reason)
{
    if (tx.version > TX_MAX_STANDARD_VERSION || tx.version < 1) {
        reason = "version";
        return false;
    }

    // Extremely large transactions with lots of inputs can cost the network
    // almost as much to process as they cost the sender in fees, because
    // computing signature hashes is O(ninputs*txsize). Limiting transactions
    // to MAX_STANDARD_TX_WEIGHT mitigates CPU exhaustion attacks.
    unsigned int sz = GetTransactionWeight(tx);
    if (sz > MAX_STANDARD_TX_WEIGHT) {
        reason = "tx-size";
        return false;
    }

    for (const CTxIn& txin : tx.vin)
    {
        // Biggest 'standard' txin involving only keys is a 15-of-15 P2SH
        // multisig with compressed keys (remember the MAX_SCRIPT_ELEMENT_SIZE byte limit on
        // redeemScript size). That works out to a (15*(33+1))+3=513 byte
        // redeemScript, 513+1+15*(73+1)+3=1627 bytes of scriptSig, which
        // we round off to 1650(MAX_STANDARD_SCRIPTSIG_SIZE) bytes for
        // some minor future-proofing. That's also enough to spend a
        // 20-of-20 CHECKMULTISIG scriptPubKey, though such a scriptPubKey
        // is not considered standard.
        if (txin.scriptSig.size() > MAX_STANDARD_SCRIPTSIG_SIZE) {
            reason = "scriptsig-size";
            return false;
        }
        if (!txin.scriptSig.IsPushOnly()) {
            reason = "scriptsig-not-pushonly";
            return false;
        }
    }

    unsigned int nDataOut = 0;
    TxoutType whichType;
    for (const CTxOut& txout : tx.vout) {
        if (!::IsStandard(txout.scriptPubKey, max_datacarrier_bytes, whichType)) {
            reason = "scriptpubkey";
            return false;
        }

        if (whichType == TxoutType::NULL_DATA)
            nDataOut++;
        else if ((whichType == TxoutType::MULTISIG) && (!permit_bare_multisig)) {
            reason = "bare-multisig";
            return false;
        } else if (IsDust(txout, dust_relay_fee)) {
            reason = "dust";
            return false;
        }
    }

    // only one OP_RETURN txout is permitted
    if (nDataOut > 1) {
        reason = "multi-op-return";
        return false;
    }

    return true;
}